

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O0

void __thiscall Result::Result(Result *this,Individual *individual)

{
  bool bVar1;
  int n;
  element_type *peVar2;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar3;
  reference this_01;
  Task *pTVar4;
  int *coreId;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int taskId;
  Individual *local_18;
  Individual *individual_local;
  Result *this_local;
  
  local_18 = individual;
  individual_local = (Individual *)this;
  std::vector<Core,_std::allocator<Core>_>::vector(&this->Cores);
  std::shared_ptr<Instance>::shared_ptr(&this->usedInstance);
  Individual::getUsedInstance((Individual *)&stack0xffffffffffffffd8);
  std::shared_ptr<Instance>::operator=
            (&this->usedInstance,(shared_ptr<Instance> *)&stack0xffffffffffffffd8);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)&stack0xffffffffffffffd8);
  peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->usedInstance);
  n = Instance::getNumProcessors(peVar2);
  Resize(this,n);
  __range1._0_4_ = 0;
  this_00 = Individual::getCoresAsignedToTasks(individual);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this_00);
  coreId = (int *)std::vector<int,_std::allocator<int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&coreId);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    this_01 = std::vector<Core,_std::allocator<Core>_>::at(&this->Cores,(long)*piVar3);
    peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->usedInstance);
    pTVar4 = Instance::getNthTask(peVar2,(int)__range1);
    Core::addtask(this_01,*pTVar4);
    __range1._0_4_ = (int)__range1 + 1;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  calcmax(this);
  return;
}

Assistant:

Result::Result(Individual individual){
	usedInstance = individual.getUsedInstance();
	Resize(usedInstance->getNumProcessors());

	int taskId = 0;
	for(auto& coreId : individual.getCoresAsignedToTasks()){
		Cores.at(coreId).addtask( usedInstance->getNthTask(taskId) );
		taskId++;
	}

	calcmax();
}